

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

UChar * ufmt_getUChars_63(UFormattable *fmt,int32_t *len,UErrorCode *status)

{
  short sVar1;
  UnicodeString *this;
  char16_t *pcVar2;
  int32_t iVar3;
  
  if (*(int *)(fmt + 5) == 3) {
    this = icu_63::Formattable::getString((Formattable *)fmt,status);
    if ((len != (int32_t *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      *len = iVar3;
    }
    pcVar2 = icu_63::UnicodeString::getTerminatedBuffer(this);
    return pcVar2;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *status = U_INVALID_FORMAT_ERROR;
  }
  return (UChar *)0x0;
}

Assistant:

U_DRAFT const UChar* U_EXPORT2
ufmt_getUChars(UFormattable *fmt, int32_t *len, UErrorCode *status) {
  Formattable *obj = Formattable::fromUFormattable(fmt);

  // avoid bogosity by checking the type first.
  if( obj->getType() != Formattable::kString ) {
    if( U_SUCCESS(*status) ){
      *status = U_INVALID_FORMAT_ERROR;
    }
    return NULL;
  }

  // This should return a valid string
  UnicodeString &str = obj->getString(*status);
  if( U_SUCCESS(*status) && len != NULL ) {
    *len = str.length();
  }
  return str.getTerminatedBuffer();
}